

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void fmt::report_system_error(int error_code,StringRef message)

{
  char *pcVar1;
  size_t in_R8;
  StringRef message_00;
  MemoryWriter full_message;
  
  full_message.super_BasicWriter<char>.buffer_ = &full_message.buffer_.super_Buffer<char>;
  full_message.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00117cd0;
  pcVar1 = full_message.buffer_.data_;
  full_message.buffer_.super_Buffer<char>.size_ = 0;
  full_message.buffer_.super_Buffer<char>.capacity_ = 500;
  full_message.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00117d18;
  message_00.size_ = in_R8;
  message_00.data_ = (char *)message.size_;
  full_message.buffer_.super_Buffer<char>.ptr_ = pcVar1;
  internal::format_system_error
            ((internal *)&full_message,(Writer *)(ulong)(uint)error_code,(int)message.data_,
             message_00);
  fwrite((full_message.super_BasicWriter<char>.buffer_)->ptr_,
         (full_message.super_BasicWriter<char>.buffer_)->size_,1,_stderr);
  fputc(10,_stderr);
  full_message.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00117cd0;
  full_message.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00117d18;
  if (full_message.buffer_.super_Buffer<char>.ptr_ != pcVar1) {
    operator_delete(full_message.buffer_.super_Buffer<char>.ptr_,
                    full_message.buffer_.super_Buffer<char>.capacity_);
  }
  return;
}

Assistant:

FMT_FUNC void fmt::report_system_error(
    int error_code, fmt::StringRef message) FMT_NOEXCEPT {
  // 'fmt::' is for bcc32.
  fmt::report_error(internal::format_system_error, error_code, message);
}